

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_features_disable_recursive(lys_feature *f)

{
  lys_node *f_00;
  lys_feature *depf;
  uint i;
  lys_feature *f_local;
  
  f->flags = f->flags & 0xfeff;
  if (f->depfeatures != (ly_set *)0x0) {
    for (depf._4_4_ = 0; depf._4_4_ < f->depfeatures->number; depf._4_4_ = depf._4_4_ + 1) {
      f_00 = (f->depfeatures->set).s[depf._4_4_];
      if ((f_00->flags & 0x100) != 0) {
        lys_features_disable_recursive((lys_feature *)f_00);
      }
    }
  }
  return;
}

Assistant:

static void
lys_features_disable_recursive(struct lys_feature *f)
{
    unsigned int i;
    struct lys_feature *depf;

    /* disable the feature */
    f->flags &= ~LYS_FENABLED;

    /* by disabling feature we have to disable also all features that depends on this feature */
    if (f->depfeatures) {
        for (i = 0; i < f->depfeatures->number; i++) {
            depf = (struct lys_feature *)f->depfeatures->set.g[i];
            if (depf->flags & LYS_FENABLED) {
                lys_features_disable_recursive(depf);
            }
        }
    }
}